

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp-server.c
# Opt level: O3

int main(int argc,char **argv)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  FILE *__stream;
  time_t tVar9;
  undefined4 *puVar10;
  int *piVar11;
  byte bVar12;
  size_t __n;
  uint *__cp;
  byte *pbVar13;
  char *pcVar14;
  byte *pbVar15;
  uint uVar16;
  byte *pbVar17;
  addrinfo *paVar18;
  uint uVar19;
  bool bVar20;
  int processedSize;
  socklen_t addr_len;
  options_occur_t opt_occurence;
  timeval tod;
  time_t recvtime;
  addrinfo *servinfo;
  server_info_t server_info_storage;
  int option_index;
  sockaddr_storage their_addr;
  char s [46];
  int local_6b8;
  uint local_6b4;
  byte *local_6b0;
  byte *local_6a8;
  uint local_69c;
  byte *local_698;
  byte *local_690;
  byte *local_688;
  byte *local_680;
  socklen_t local_674;
  options_occur_t local_670;
  int local_664;
  FILE *local_660;
  timeval local_658;
  ulong local_648;
  time_t local_640;
  addrinfo *local_638;
  long local_630;
  byte local_608;
  char local_607;
  byte local_606;
  undefined4 local_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  char local_5f4;
  byte local_5f3;
  char local_5f2 [66];
  ulong local_5b0;
  long local_5a8;
  time_t local_5a0;
  char local_598 [48];
  undefined4 local_568;
  uint local_564;
  uint local_560;
  undefined4 local_55c;
  int iStack_558;
  uint local_554;
  byte local_550;
  ushort local_54c;
  ushort local_54a;
  undefined4 local_548;
  byte bStack_544;
  ushort uStack_540;
  ushort uStack_53e;
  undefined4 auStack_53c [265];
  addrinfo local_118 [2];
  char local_98 [48];
  char local_68 [56];
  
  local_568 = 0;
  _opterr = 0;
  local_6b0 = (byte *)CONCAT44(local_6b0._4_4_,2);
  local_690 = (byte *)CONCAT44(local_690._4_4_,0xff);
  local_698 = (byte *)0x10401d;
  local_69c = 0;
  local_664 = 0;
  local_688 = (byte *)0x0;
  local_648 = 0;
  local_660 = (FILE *)((ulong)local_660 & 0xffffffff00000000);
  pbVar15 = (byte *)"5351";
LAB_00101489:
  do {
    do {
      local_680 = pbVar15;
      iVar3 = getopt_long(argc,argv,"hr:v:p:",main::long_options,&local_568);
      pbVar15 = _optarg;
      if (0x6f < iVar3) {
        if (iVar3 == 0x70) {
          uVar4 = atoi((char *)_optarg);
          if (uVar4 - 0x10000 < 0xffff0001) {
            printf("Bad value for option -p %d \n",(ulong)uVar4);
            puts("Port value can be in range 1-65535. ");
            puts("Default value will be used. ");
            pbVar15 = local_680;
          }
          goto LAB_00101489;
        }
        if (iVar3 == 0x72) {
          uVar4 = atoi((char *)_optarg);
          local_690 = (byte *)CONCAT44(local_690._4_4_,uVar4);
          uVar4 = uVar4 & 0xff;
          uVar7 = (ulong)uVar4;
          pbVar15 = local_680;
          if (uVar4 == 0xff || uVar4 < 0xe) goto LAB_00101489;
          pcVar14 = 
          "Unsupported  RESULT CODE %d (acceptable values 0 <= result_code <= 13 or result_code == 255)\n"
          ;
        }
        else {
          if (iVar3 != 0x76) goto LAB_00102c37;
          uVar4 = atoi((char *)_optarg);
          local_6b0 = (byte *)CONCAT44(local_6b0._4_4_,uVar4);
          uVar7 = (ulong)(uVar4 & 0xff);
          pbVar15 = local_680;
          if (0xfffffffd < (uVar4 & 0xff) - 3) goto LAB_00101489;
          pcVar14 = "Version %d is not supported! \n";
        }
LAB_00102c8d:
        printf(pcVar14,uVar7);
        goto LAB_00102c3c;
      }
      if (iVar3 < 0) {
        if (iVar3 == -1) {
          local_606 = (byte)local_690;
          local_607 = (char)local_660;
          local_608 = (byte)local_6b0;
          local_5b0 = local_648 / 1000;
          local_5a8 = (local_648 % 1000) * 1000;
          local_5a0 = time((time_t *)0x0);
          pbVar15 = local_688;
          local_5f4 = (char)local_69c;
          local_5f3 = (byte)local_664;
          if (local_688 == (byte *)0x0) {
            local_5f2[0] = '\0';
          }
          else {
            sVar6 = strlen((char *)local_688);
            __n = 0x40;
            if (sVar6 + 1 < 0x40) {
              __n = sVar6 + 1;
            }
            memcpy(local_5f2,pbVar15,__n);
          }
          pbVar13 = local_680;
          pbVar15 = local_698;
          printf("Server listening on %s:%s \n",local_698,local_680);
          local_670.third_party_occur = 0;
          local_670.pfailure_occur = 0;
          local_674 = 0;
          memset(&local_568,0,0x44c);
          bVar12 = local_607 + (local_607 == '\0');
          uVar4 = 1;
          local_598[0] = '\x01';
          local_598[1] = '\0';
          local_598[2] = '\0';
          local_598[3] = '\0';
          local_118[0].ai_addrlen = 0;
          local_118[0]._20_4_ = 0;
          local_118[0].ai_addr = (sockaddr *)0x0;
          local_118[0].ai_canonname = (char *)0x0;
          local_118[0].ai_next = (addrinfo *)0x0;
          local_118[0].ai_socktype = 2;
          local_118[0].ai_protocol = 0;
          local_118[0].ai_flags = 1;
          local_118[0].ai_family = 0;
          iVar3 = getaddrinfo((char *)pbVar15,(char *)pbVar13,local_118,&local_638);
          if (iVar3 != 0) {
            main_cold_2();
            goto LAB_001018d2;
          }
          if (local_638 == (addrinfo *)0x0) goto LAB_001018c0;
          paVar18 = local_638;
          uVar5 = uVar4;
          goto LAB_0010185c;
        }
        goto LAB_00102c37;
      }
      if (iVar3 != 0) {
        if (iVar3 == 0x3f) goto LAB_00102c4b;
        goto LAB_00102c37;
      }
      pcVar14 = main::long_options[(int)local_568].name;
      pbVar15 = local_680;
    } while (pcVar14 == (char *)0x0);
    iVar3 = strcmp(pcVar14,"ear");
    local_6a8 = _optarg;
    if (iVar3 == 0) {
      iVar3 = atoi((char *)_optarg);
      local_660 = (FILE *)CONCAT44(local_660._4_4_,iVar3);
    }
    iVar3 = strcmp(pcVar14,"timeout");
    if (iVar3 == 0) {
      uVar4 = atoi((char *)local_6a8);
      if ((int)uVar4 < 0) {
        pcVar14 = "Value provided for timeout was negative %d. Please provide correct value.\n";
        uVar7 = (ulong)uVar4;
        goto LAB_00102c8d;
      }
      local_648 = (ulong)uVar4;
    }
    iVar3 = strcmp(pcVar14,"app-bit");
    local_69c = local_69c & 0xff;
    if (iVar3 == 0) {
      local_69c = 1;
    }
    iVar3 = strcmp(pcVar14,"ret-dscp");
    if (iVar3 == 0) {
      local_664 = atoi((char *)local_6a8);
    }
    iVar3 = strcmp(pcVar14,"log-file");
    if (iVar3 == 0) {
      local_688 = local_6a8;
    }
    if (((*pcVar14 == 'i') && (pcVar14[1] == 'p')) && (pcVar14[2] == '\0')) {
      local_698 = local_6a8;
    }
    iVar3 = strcmp(pcVar14,"ext-ip");
    if (iVar3 == 0) {
      inet_pton(10,(char *)local_6a8,&local_604);
      pcVar14 = main::long_options[(int)local_568].name;
    }
    iVar3 = strcmp(pcVar14,"help");
    pbVar15 = local_680;
  } while (iVar3 != 0);
LAB_00102c37:
  print_usage();
LAB_00102c3c:
  exit(1);
LAB_0010185c:
  do {
    uVar4 = socket(paVar18->ai_family,paVar18->ai_socktype,paVar18->ai_protocol);
    pcVar14 = "PCP server: socket";
    if (uVar4 != 0xffffffff) {
      setsockopt(uVar4,1,2,local_598,4);
      iVar3 = bind(uVar4,paVar18->ai_addr,paVar18->ai_addrlen);
      if (iVar3 != -1) goto LAB_001018c5;
      close(uVar4);
      pcVar14 = "PCP server: bind";
      uVar5 = uVar4;
    }
    perror(pcVar14);
    paVar18 = paVar18->ai_next;
    uVar4 = uVar5;
  } while (paVar18 != (addrinfo *)0x0);
LAB_001018c0:
  main_cold_4();
LAB_001018c5:
  freeaddrinfo(local_638);
LAB_001018d2:
  uVar5 = (uint)bVar12;
  gettimeofday(&local_658,(__timezone_ptr_t)0x0);
  local_688 = (byte *)(local_5b0 + local_658.tv_sec);
  pbVar15 = (byte *)(local_658.tv_usec + local_5a8);
  local_69c = uVar4;
  while( true ) {
    bVar20 = local_607 == '\0';
    local_640 = 0;
    if (local_5a8 != 0 || local_5b0 != 0) {
      gettimeofday(&local_658,(__timezone_ptr_t)0x0);
      lVar2 = (long)pbVar15 / 1000000;
      pbVar13 = (byte *)((long)pbVar15 % 1000000);
      pbVar15 = pbVar13 + 1000000;
      if (-1 < (long)pbVar13) {
        pbVar15 = pbVar13;
      }
      local_658.tv_sec = local_658.tv_usec / 1000000 + local_658.tv_sec;
      local_658.tv_usec = local_658.tv_usec % 1000000;
      if (local_658.tv_usec < 0) {
        local_658.tv_usec = local_658.tv_usec + 1000000;
        local_658.tv_sec = local_658.tv_sec + -1;
      }
      local_688 = local_688 + ((long)pbVar13 >> 0x3f) + lVar2;
      if (((long)local_688 < local_658.tv_sec) ||
         (((long)local_688 <= local_658.tv_sec && (pbVar15 <= (ulong)local_658.tv_usec)))) {
        local_638 = (addrinfo *)0x0;
        local_630 = 0;
      }
      else {
        if (pbVar15 < (ulong)local_658.tv_usec) {
          local_658.tv_usec = local_658.tv_usec + -1000000;
          local_658.tv_sec = local_658.tv_sec + 1;
        }
        iVar3 = (int)pbVar15 - (int)local_658.tv_usec;
        local_638 = (addrinfo *)(local_688 + (iVar3 / 1000000 - local_658.tv_sec));
        iVar3 = iVar3 % 1000000;
        local_630 = (long)iVar3;
        if (iVar3 < 0) {
          local_630 = local_630 + 1000000;
          local_638 = (addrinfo *)((long)&local_638[-1].ai_next + 7);
        }
      }
      setsockopt(uVar4,1,0x14,&local_638,0x10);
    }
    puts("###############################################");
    puts("### PCP test server: waiting to recvfrom... ###");
    puts("###############################################");
    local_674 = 0x80;
    uVar7 = recvfrom(uVar4,&local_568,1099,0,(sockaddr *)local_118,&local_674);
    uVar19 = (uint)uVar7;
    if (uVar19 == 0xffffffff) break;
    time(&local_640);
    pcVar14 = ctime(&local_640);
    pcVar8 = inet_ntop((uint)(ushort)local_118[0].ai_flags,
                       &local_118[0].ai_family + ((ushort)local_118[0].ai_flags != 2),local_68,0x2e)
    ;
    printf("PCP server: got packet at %s from %s\n",pcVar14,pcVar8);
    printf("PCP server: packet is %d bytes long\n",uVar7 & 0xffffffff);
    bVar12 = local_608;
    local_680 = (byte *)CONCAT44(local_680._4_4_,(uVar5 - 1) + (uint)bVar20);
    if (uVar19 - 4 < 0x449 && (uVar7 & 3) == 0) {
      if (local_5f2[0] == '\0') {
        __stream = (FILE *)0x0;
      }
      else {
        umask(0);
        __stream = fopen(local_5f2,"w+");
        if (__stream == (FILE *)0x0) goto LAB_00102c50;
      }
      local_6b8 = 0;
      local_6b4 = uVar19;
      putchar(10);
      if (__stream == (FILE *)0x0) {
        printf("PCP version:             %i\n",(ulong)(byte)local_568);
      }
      else {
        fputc(10,__stream);
        printf("PCP version:             %i\n",(ulong)(byte)local_568);
        fprintf(__stream,"PCP version:             %i\n",(ulong)(byte)local_568);
      }
      printf("PCP opcode:              %i\n",(ulong)(local_568 >> 8 & 0x7f));
      if (__stream == (FILE *)0x0) {
        printf("PCP R bit:               %i\n",(ulong)(local_568._1_1_ >> 7),
               (ulong)(local_568._1_1_ >> 7));
      }
      else {
        fprintf(__stream,"PCP opcode:              %i\n",(ulong)(local_568._1_1_ & 0x7f));
        printf("PCP R bit:               %i\n",(ulong)(local_568._1_1_ >> 7));
        fprintf(__stream,"PCP R bit:               %i\n",(ulong)(local_568._1_1_ >> 7));
      }
      printf("PCP requested lifetime:  %lu\n",
             (ulong)(local_564 >> 0x18 | (local_564 & 0xff0000) >> 8 | (local_564 & 0xff00) << 8 |
                    local_564 << 0x18));
      if (__stream != (FILE *)0x0) {
        fprintf(__stream,"PCP requested lifetime:  %lu\n",
                (ulong)(local_564 >> 0x18 | (local_564 & 0xff0000) >> 8 | (local_564 & 0xff00) << 8
                       | local_564 << 0x18));
      }
      if (((local_560 == 0) && (local_55c == 0)) && (iStack_558 == -0x10000)) {
        pcVar14 = inet_ntop(2,&local_554,local_98,0x2e);
        printf("PEER IP: \t\t %s\n",pcVar14);
        if (__stream == (FILE *)0x0) goto LAB_00101d7e;
        iVar3 = 2;
        __cp = &local_554;
LAB_00101d3d:
        pcVar14 = inet_ntop(iVar3,__cp,local_98,0x2e);
        fprintf(__stream,"PEER IP: \t\t %s\n",pcVar14);
        local_6b8 = 0x18;
        putchar(10);
        fputc(10,__stream);
      }
      else {
        pcVar14 = inet_ntop(10,&local_560,local_98,0x2e);
        printf("PEER IP: \t\t %s\n",pcVar14);
        if (__stream != (FILE *)0x0) {
          iVar3 = 10;
          __cp = &local_560;
          goto LAB_00101d3d;
        }
LAB_00101d7e:
        local_6b8 = 0x18;
        putchar(10);
      }
      uVar16 = 1;
      if ((byte)local_568 <= bVar12) {
        pbVar13 = (byte *)(ulong)(uVar19 - 0x18);
        if ((local_568 & 0xff) == 2) {
          uVar4 = 0;
          if ((local_568._1_1_ & 0x7f) == 1) {
            uVar16 = 6;
            local_6b4 = uVar19 - 0x3c;
            if (uVar19 < 0x3c) goto LAB_00102ac8;
            local_6b0 = (byte *)CONCAT44(local_6b0._4_4_,local_6b4);
            local_6a8 = pbVar13;
            puts("PCP protocol VERSION 2. ");
            if (__stream == (FILE *)0x0) {
              printf("MAP protocol: \t\t %d\n",(ulong)bStack_544);
            }
            else {
              fwrite("PCP protocol VERSION 2. \n",0x19,1,__stream);
              printf("MAP protocol: \t\t %d\n",(ulong)bStack_544);
              fprintf(__stream,"MAP protocol: \t\t %d\n",(ulong)bStack_544);
            }
            printf("MAP int port: \t\t %d\n",(ulong)(ushort)(uStack_540 << 8 | uStack_540 >> 8));
            if (__stream == (FILE *)0x0) {
              printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(uStack_53e << 8 | uStack_53e >> 8));
            }
            else {
              fprintf(__stream,"MAP int port: \t\t %d\n",
                      (ulong)(ushort)(uStack_540 << 8 | uStack_540 >> 8));
              printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(uStack_53e << 8 | uStack_53e >> 8));
              fprintf(__stream,"MAP ext port: \t\t %d\n",
                      (ulong)(ushort)(uStack_53e << 8 | uStack_53e >> 8));
            }
            pcVar14 = inet_ntop(10,auStack_53c,(char *)&local_638,0x2e);
            printf("MAP Ext IP: \t\t %s\n",pcVar14);
            if (__stream != (FILE *)0x0) {
              pcVar14 = inet_ntop(10,auStack_53c,(char *)&local_638,0x2e);
              fprintf(__stream,"MAP Ext IP: \t\t %s\n",pcVar14);
            }
            local_6b8 = 0x3c;
            uVar4 = 0;
            printf("Remaining size is %d \n",(ulong)local_6b0 & 0xffffffff);
            pbVar13 = (byte *)0x0;
            if ((int)local_6a8 != 0x24) {
              local_6b0 = pbVar15;
              do {
                uVar4 = print_PCP_options(&local_568,(int *)&local_6b4,&local_6b8,&local_670,
                                          (FILE *)__stream);
                pbVar13 = (byte *)(ulong)local_6b4;
                pbVar15 = local_6b0;
              } while (0 < (int)local_6b4);
            }
          }
          if ((local_568._1_1_ & 0x7f) == 2) {
            local_6b4 = (int)pbVar13 - 0x38;
            printf("Remaining size is %d \n");
            uVar5 = (int)pbVar13 - 0x38;
            if ((int)uVar5 < 0) {
LAB_001023ea:
              uVar16 = 6;
              goto LAB_00102ac8;
            }
            pbVar13 = (byte *)(long)local_6b8;
            local_6a8 = (byte *)(ulong)uVar5;
            puts("PCP protocol VERSION 2. ");
            local_690 = pbVar13;
            if (__stream == (FILE *)0x0) {
              puts("PEER Opcode specific information. ");
              printf("Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_55c + (long)pbVar13));
            }
            else {
              fwrite("PCP protocol VERSION 2. \n",0x19,1,__stream);
              puts("PEER Opcode specific information. ");
              fwrite("PEER Opcode specific information. \n",0x23,1,__stream);
              printf("Protocol: \t\t %d\n",(ulong)*(byte *)((long)&local_55c + (long)pbVar13));
              fprintf(__stream,"Protocol: \t\t %d\n",
                      (ulong)*(byte *)((long)&local_55c + (long)pbVar13));
            }
            printf("Internal port: \t\t %d\n",
                   (ulong)(ushort)(*(ushort *)(pbVar13 + (long)&iStack_558) << 8 |
                                  *(ushort *)(pbVar13 + (long)&iStack_558) >> 8));
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"Internal port: \t\t %d\n",
                      (ulong)(ushort)(*(ushort *)(pbVar13 + (long)&iStack_558) << 8 |
                                     *(ushort *)(pbVar13 + (long)&iStack_558) >> 8));
            }
            local_698 = (byte *)((long)&local_568 + (long)pbVar13);
            pcVar14 = inet_ntop(10,(byte *)((long)&local_554 + (long)pbVar13),(char *)&local_638,
                                0x2e);
            printf("External IP: \t\t %s\n",pcVar14);
            if (__stream != (FILE *)0x0) {
              pcVar14 = inet_ntop(10,(byte *)((long)&local_554 + (long)pbVar13),(char *)&local_638,
                                  0x2e);
              fprintf(__stream,"External IP: \t\t %s\n",pcVar14);
            }
            pbVar13 = local_698;
            printf("External port: \t\t %d\n",
                   (ulong)(ushort)(*(ushort *)(local_698 + 0x12) << 8 |
                                  *(ushort *)(local_698 + 0x12) >> 8));
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"External port: \t\t %d\n",
                      (ulong)(ushort)(*(ushort *)(pbVar13 + 0x12) << 8 |
                                     *(ushort *)(pbVar13 + 0x12) >> 8));
            }
            if (((*(int *)(pbVar13 + 0x28) == 0) && (*(int *)(pbVar13 + 0x2c) == 0)) &&
               (*(int *)(pbVar13 + 0x30) == -0x10000)) {
              pbVar17 = pbVar13 + 0x34;
              pcVar14 = inet_ntop(2,pbVar17,local_598,0x2e);
              printf("PEER IP: \t\t %s\n",pcVar14);
              if (__stream != (FILE *)0x0) {
                iVar3 = 2;
LAB_0010277a:
                pcVar14 = inet_ntop(iVar3,pbVar17,local_598,0x2e);
                fprintf(__stream,"PEER IP: \t\t %s\n",pcVar14);
              }
            }
            else {
              pbVar17 = pbVar13 + 0x28;
              pcVar14 = inet_ntop(10,pbVar17,local_598,0x2e);
              printf("PEER IP: \t\t %s\n",pcVar14);
              if (__stream != (FILE *)0x0) {
                iVar3 = 10;
                goto LAB_0010277a;
              }
            }
            local_6b0 = pbVar15;
            printf("PEER port: \t\t %d\n",
                   (ulong)(ushort)(*(ushort *)(pbVar13 + 0x24) << 8 |
                                  *(ushort *)(pbVar13 + 0x24) >> 8));
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"PEER port: \t\t %d\n",
                      (ulong)(ushort)(*(ushort *)(pbVar13 + 0x24) << 8 |
                                     *(ushort *)(pbVar13 + 0x24) >> 8));
            }
            local_6b8 = (int)local_690 + 0x38;
            if ((int)local_6a8 != 0) {
              do {
                uVar4 = print_PCP_options(&local_568,(int *)&local_6b4,&local_6b8,&local_670,
                                          (FILE *)__stream);
                pbVar13 = (byte *)(ulong)local_6b4;
              } while (0 < (int)local_6b4);
              pbVar15 = local_6b0;
              goto LAB_00102835;
            }
            uVar16 = 3;
            pbVar15 = local_6b0;
            if ((local_568._1_1_ & 0x7f) == 3) goto LAB_00102ac8;
          }
          else {
LAB_00102835:
            if ((local_568._1_1_ & 0x7f) == 3) {
              uVar16 = 3;
              if ((int)pbVar13 < 0xe) goto LAB_00102ac8;
              local_6b0 = (byte *)(long)local_6b8;
              local_6a8 = pbVar13;
              puts("PCP protocol VERSION 2. ");
              if (__stream == (FILE *)0x0) {
                puts("SADSCP Opcode specific information. ");
              }
              else {
                fwrite("PCP protocol VERSION 2. \n",0x19,1,__stream);
                puts("SADSCP Opcode specific information. ");
                fwrite("SADSCP Opcode specific information. \n",0x25,1,__stream);
              }
              pbVar13 = local_6b0;
              printf("Jitter tolerance:\t %d\n",
                     (ulong)(*(byte *)((long)&local_55c + (long)local_6b0) >> 2 & 3));
              if (__stream == (FILE *)0x0) {
                bVar12 = *(byte *)((long)&local_55c + (long)pbVar13) >> 4 & 3;
                printf("Loss tolerance: \t %d\n",(ulong)bVar12,(ulong)bVar12);
              }
              else {
                fprintf(__stream,"Jitter tolerance:\t %d\n",
                        (ulong)(*(byte *)((long)&local_55c + (long)pbVar13) >> 2 & 3));
                printf("Loss tolerance: \t %d\n",
                       (ulong)(*(byte *)((long)&local_55c + (long)pbVar13) >> 4 & 3));
                fprintf(__stream,"Loss tolerance: \t %d\n",
                        (ulong)(*(byte *)((long)&local_55c + (long)pbVar13) >> 4 & 3));
              }
              printf("Delay tolerance:  \t %d\n",
                     (ulong)(*(byte *)((long)&local_55c + (long)pbVar13) >> 6));
              if (__stream == (FILE *)0x0) {
                pbVar17 = pbVar13 + (long)&local_55c + 1;
                printf("App name length: \t %d\n",(ulong)pbVar13[(long)&local_55c + 1]);
                printf("App name:        \t %.*s\n",(ulong)pbVar13[(long)&local_55c + 1],
                       pbVar13 + (long)&local_55c + 2);
              }
              else {
                local_660 = __stream;
                fprintf(__stream,"Delay tolerance:  \t %d\n",
                        (ulong)(*(byte *)((long)&local_55c + (long)pbVar13) >> 6));
                local_690 = pbVar13 + (long)&local_55c + 1;
                printf("App name length: \t %d\n",(ulong)pbVar13[(long)&local_55c + 1]);
                __stream = local_660;
                fprintf(local_660,"App name length: \t %d\n",(ulong)pbVar13[(long)&local_55c + 1]);
                printf("App name:        \t %.*s\n",(ulong)pbVar13[(long)&local_55c + 1]);
                pbVar17 = local_690;
                fprintf(__stream,"App name:        \t %.*s\n",(ulong)pbVar13[(long)&local_55c + 1],
                        pbVar13 + (long)&local_55c + 2);
              }
              local_6b8 = (int)local_6b0 + (uint)*pbVar17 + 0xe;
              iVar3 = *pbVar17 + 0xe;
              local_6b4 = (int)local_6a8 - iVar3;
              if (local_6b4 != 0 && iVar3 <= (int)local_6a8) {
                local_6b0 = pbVar15;
                do {
                  uVar4 = print_PCP_options(&local_568,(int *)&local_6b4,&local_6b8,&local_670,
                                            (FILE *)__stream);
                  pbVar15 = local_6b0;
                } while (0 < (int)local_6b4);
              }
            }
          }
        }
        else {
          if ((local_568 & 0xff) != 1) goto LAB_00102ac8;
          uVar4 = 0;
          uVar5 = uVar19 - 0x18;
          if ((local_568._1_1_ & 0x7f) == 1) {
            local_6b4 = uVar19 - 0x30;
            uVar16 = 6;
            if (uVar19 < 0x30) goto LAB_00102ac8;
            local_6b0 = (byte *)CONCAT44(local_6b0._4_4_,local_6b4);
            local_6a8 = pbVar13;
            puts("PCP protocol VERSION 1. ");
            if (__stream == (FILE *)0x0) {
              printf("MAP protocol: \t\t %d\n",(ulong)local_550);
            }
            else {
              fwrite("PCP protocol VERSION 1. \n",0x19,1,__stream);
              printf("MAP protocol: \t\t %d\n",(ulong)local_550);
              fprintf(__stream,"MAP protocol: \t\t %d\n",(ulong)local_550);
            }
            printf("MAP int port: \t\t %d\n",(ulong)(ushort)(local_54c << 8 | local_54c >> 8));
            if (__stream == (FILE *)0x0) {
              printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(local_54a << 8 | local_54a >> 8));
            }
            else {
              fprintf(__stream,"MAP int port: \t\t %d\n",
                      (ulong)(ushort)(local_54c << 8 | local_54c >> 8));
              printf("MAP ext port: \t\t %d\n",(ulong)(ushort)(local_54a << 8 | local_54a >> 8));
              fprintf(__stream,"MAP ext port: \t\t %d\n",
                      (ulong)(ushort)(local_54a << 8 | local_54a >> 8));
            }
            pcVar14 = inet_ntop(10,&local_548,(char *)&local_638,0x2e);
            printf("MAP Ext IP: \t\t %s\n",pcVar14);
            if (__stream != (FILE *)0x0) {
              pcVar14 = inet_ntop(10,&local_548,(char *)&local_638,0x2e);
              fprintf(__stream,"MAP Ext IP: \t\t %s\n",pcVar14);
            }
            local_6b8 = 0x30;
            uVar4 = 0;
            printf("Remaining size is %d \n",(ulong)local_6b0 & 0xffffffff);
            uVar5 = 0;
            if ((int)local_6a8 != 0x18) {
              local_6b0 = pbVar15;
              do {
                uVar4 = print_PCP_options(&local_568,(int *)&local_6b4,&local_6b8,&local_670,
                                          (FILE *)__stream);
                pbVar15 = local_6b0;
                uVar5 = local_6b4;
              } while (0 < (int)local_6b4);
            }
          }
          if ((local_568._1_1_ & 0x7f) == 2) {
            local_6b4 = uVar5 - 0x18;
            printf("Remaining size is %d \n");
            if ((int)(uVar5 - 0x18) < 0) goto LAB_001023ea;
            pbVar13 = (byte *)(long)local_6b8;
            local_6a8 = (byte *)(ulong)(uVar5 - 0x18);
            puts("PCP protocol VERSION 1. ");
            pbVar17 = (byte *)((long)&local_568 + (long)pbVar13);
            local_690 = pbVar13;
            if (__stream == (FILE *)0x0) {
              puts("PEER Opcode specific information. ");
              printf("Protocol: \t\t %d\n",(ulong)*pbVar17);
            }
            else {
              fwrite("PCP protocol VERSION 1. \n",0x19,1,__stream);
              puts("PEER Opcode specific information. ");
              fwrite("PEER Opcode specific information. \n",0x23,1,__stream);
              printf("Protocol: \t\t %d\n",(ulong)*pbVar17);
              fprintf(__stream,"Protocol: \t\t %d\n",(ulong)*pbVar17);
            }
            printf("Internal port: \t\t %d\n",
                   (ulong)(ushort)(*(ushort *)((long)&local_564 + (long)pbVar13) << 8 |
                                  *(ushort *)((long)&local_564 + (long)pbVar13) >> 8));
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"Internal port: \t\t %d\n",
                      (ulong)(ushort)(*(ushort *)((long)&local_564 + (long)pbVar13) << 8 |
                                     *(ushort *)((long)&local_564 + (long)pbVar13) >> 8));
            }
            local_698 = (byte *)((long)&local_560 + (long)pbVar13);
            local_6b0 = pbVar17;
            pcVar14 = inet_ntop(10,local_698,(char *)&local_638,0x2e);
            printf("External IP: \t\t %s\n",pcVar14);
            if (__stream != (FILE *)0x0) {
              pcVar14 = inet_ntop(10,local_698,(char *)&local_638,0x2e);
              fprintf(__stream,"External IP: \t\t %s\n",pcVar14);
            }
            pbVar13 = local_6b0;
            printf("External port port: \t\t %d\n",
                   (ulong)(ushort)(*(ushort *)(local_6b0 + 6) << 8 | *(ushort *)(local_6b0 + 6) >> 8
                                  ));
            if (__stream != (FILE *)0x0) {
              uVar1 = *(ushort *)(pbVar13 + 6);
              fprintf(__stream,"External port port: \t\t %d\n",
                      (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
            }
            local_698 = pbVar13 + 0x1c;
            pcVar14 = inet_ntop(10,local_698,local_598,0x2e);
            printf("PEER IP: \t\t %s\n",pcVar14);
            if (__stream != (FILE *)0x0) {
              pcVar14 = inet_ntop(10,local_698,local_598,0x2e);
              fprintf(__stream,"PEER IP: \t\t %s\n",pcVar14);
            }
            pbVar13 = local_6b0;
            printf("PEER port port: \t\t %d\n",
                   (ulong)(ushort)(*(ushort *)(local_6b0 + 0x18) << 8 |
                                  *(ushort *)(local_6b0 + 0x18) >> 8));
            if (__stream != (FILE *)0x0) {
              fprintf(__stream,"PEER port port: \t\t %d\n",
                      (ulong)(ushort)(*(ushort *)(pbVar13 + 0x18) << 8 |
                                     *(ushort *)(pbVar13 + 0x18) >> 8));
            }
            local_6b8 = (int)local_690 + 0x2c;
            if ((int)local_6a8 != 0) {
              local_6b0 = pbVar15;
              do {
                uVar4 = print_PCP_options(&local_568,(int *)&local_6b4,&local_6b8,&local_670,
                                          (FILE *)__stream);
                pbVar15 = local_6b0;
              } while (0 < (int)local_6b4);
            }
          }
        }
        fflush(__stream);
        uVar16 = uVar4;
      }
    }
    else {
      puts(
          "Size of PCP packet is either smaller than 4 octets or larger than 1100 bytes or the size is not multiple of 4."
          );
      printf("The size was: %d \n",uVar7 & 0xffffffff);
      uVar16 = 3;
    }
LAB_00102ac8:
    if (local_606 != 0xff) {
      uVar16 = (uint)local_606;
    }
    _local_55c = 0;
    local_554 = 0;
    uVar1 = (ushort)local_568;
    local_568._0_3_ = (uint3)(uVar1 | 0x8000);
    local_568 = CONCAT13((char)uVar16,(uint3)local_568);
    tVar9 = time((time_t *)0x0);
    uVar4 = local_69c;
    uVar5 = (int)tVar9 - (int)local_5a0;
    local_560 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
    uVar5 = (uint)local_680;
    if (uVar16 == 1) {
      local_568 = CONCAT31(local_568._1_3_,local_608);
    }
    else if ((local_568._1_1_ & 0x7f) == 3) {
      bStack_544 = local_5f4 << 7 | local_5f3;
    }
    else if ((local_568._1_1_ & 0x7f) == 1) {
      if ((local_568 & 0xff) == 2) {
        puVar10 = auStack_53c;
      }
      else {
        if ((local_568 & 0xff) != 1) goto LAB_00102bc3;
        puVar10 = &local_548;
      }
      *puVar10 = local_604;
      puVar10[1] = uStack_600;
      puVar10[2] = uStack_5fc;
      puVar10[3] = uStack_5f8;
    }
LAB_00102bc3:
    sendto(local_69c,&local_568,(long)(int)uVar19,0,(sockaddr *)local_118,local_674);
    local_670.third_party_occur = 0;
    local_670.pfailure_occur = 0;
    putchar(10);
    if (uVar5 == 0) {
      puts("Closing sockfd ");
      close(uVar4);
      return 0;
    }
  }
  main_cold_3();
LAB_00102c4b:
  main_cold_1();
LAB_00102c50:
  piVar11 = __errno_location();
  pcVar14 = strerror(*piVar11);
  printf("%s:%d \"\": %s \n","printPCPreq",0x1b5,pcVar14);
  goto LAB_00102c3c;
}

Assistant:

int main(int argc, char *argv[]) {

    const char *port = PCP_PORT;
    int test_port;
    uint8_t pcp_version = PCP_TEST_MAX_VERSION;
    uint8_t end_after_recv = 0;
    uint8_t default_result_code = 255;
#ifdef WIN32
    long timeout_us = 0;
#else
    suseconds_t timeout_us = 0;
#endif
    server_info_t server_info_storage;
    const char *server_ip = "0.0.0.0";
    uint8_t app_bit = 0;
    uint8_t ret_dscp = 0;
    char *log_file = NULL;

    {
        int c;
        int option_index = 0;

        static struct option long_options[] = {
            {"ear", required_argument, 0, 0},
            {"help", no_argument, 0, 0},
            {"ip", required_argument, 0, 0},
            {"ext-ip", required_argument, 0, 0},
            {"timeout", required_argument, 0, 0},
            {"app-bit", no_argument, 0, 0},
            {"ret-dscp", required_argument, 0, 0},
            {"log-file", required_argument, 0, 0},
            {0, 0, 0, 0}};

        opterr = 0;
        while ((c = getopt_long(argc, argv, "hr:v:p:", long_options,
                                &option_index)) != -1) {
            switch (c) {
            // assign values for long options
            case 0:
                if (!long_options[option_index].name) {
                    break;
                }

                if (!strcmp(long_options[option_index].name, "ear"))
                    end_after_recv = (uint8_t)atoi(optarg);

                if (!strcmp(long_options[option_index].name, "timeout")) {
                    int temp_timeout = atoi(optarg);
                    if (temp_timeout < 0) {
                        printf("Value provided for timeout was negative %d. "
                               "Please provide correct value.\n",
                               temp_timeout);
                        exit(1);
                    } else {
#ifdef WIN32
                        timeout_us = (long)atoi(optarg);
#else
                        timeout_us = (suseconds_t)atoi(optarg);
#endif
                    }
                }

                if (!strcmp(long_options[option_index].name, "app-bit")) {
                    app_bit = 1;
                }

                if (!strcmp(long_options[option_index].name, "ret-dscp")) {
                    ret_dscp = (uint8_t)atoi(optarg);
                }

                if (!strcmp(long_options[option_index].name, "log-file")) {
                    log_file = optarg;
                }

                if (!strcmp(long_options[option_index].name, "ip"))
                    server_ip = optarg;

                if (!strcmp(long_options[option_index].name, "ext-ip")) {
                    inet_pton(AF_INET6, optarg, &server_info_storage.ext_ip);
                }

                if (!strcmp(long_options[option_index].name, "help")) {
                    print_usage();
                    exit(1);
                }

                break;
            case 'h':
                print_usage();
                exit(1);
                break;
            case 'p':
                test_port = atoi(optarg);
                if ((test_port < 1) || (test_port > 65535)) {
                    printf("Bad value for option -p %d \n", test_port);
                    printf("Port value can be in range 1-65535. \n");
                    printf("Default value will be used. \n");
                } else {
                    port = optarg;
                }
                break;
            case 'r':
                default_result_code = (uint8_t)atoi(optarg);
                if (default_result_code > 13 && default_result_code != 255) {
                    printf("Unsupported  RESULT CODE %d (acceptable values "
                           "0 <= result_code <= 13 or result_code == 255)\n",
                           default_result_code);
                    exit(1);
                }
                break;
            case 'v':
                pcp_version = (uint8_t)atoi(optarg);
                if (pcp_version < 1 || pcp_version > 2) {
                    printf("Version %d is not supported! \n", pcp_version);
                    exit(1);
                }
                break;
            case '?':
                if (isprint(optopt))
                    fprintf(stderr, "Unknown option `-%c'.\n", optopt);
                else
                    fprintf(stderr, "Unknown option character `\\x%x'.\n",
                            optopt);
                print_usage();
                exit(1);
            default: // LCOV_EXCL_START
                print_usage();
                exit(1);
                break; // LCOV_EXCL_STOP
            }
        }
    }

    server_info_storage.default_result_code = default_result_code;
    server_info_storage.end_after_recv = end_after_recv;
    server_info_storage.server_version = pcp_version;
    server_info_storage.tv.tv_sec = timeout_us / 1000;
    server_info_storage.tv.tv_usec = (timeout_us % 1000) * 1000;
    server_info_storage.epoch_time_start = time(NULL);
    server_info_storage.app_bit = app_bit;
    server_info_storage.ret_dscp = ret_dscp;
    if (log_file != NULL) {
        memcpy(&(server_info_storage.log_file[0]), log_file,
               min(strlen(log_file) + 1, MAX_LOG_FILE));
    } else {
        server_info_storage.log_file[0] = 0;
    }

    printf("Server listening on %s:%s \n", server_ip, port);
    return execPCPServer(port, server_ip, &server_info_storage);
}